

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O0

subsequence_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::vector<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
* __thiscall
burst::make_subsequence_iterator<std::vector<int,std::allocator<int>>const&>
          (subsequence_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::vector<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
           *__return_storage_ptr__,burst *this,vector<int,_std::allocator<int>_> *range)

{
  const_iterator this_00;
  const_iterator first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_RCX;
  vector<int,_std::allocator<int>_> *range_local;
  
  this_00 = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)this);
  first = std::end<std::vector<int,std::allocator<int>>>((vector<int,_std::allocator<int>_> *)this);
  make_subsequence_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            (__return_storage_ptr__,(burst *)this_00._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             first._M_current,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

auto make_subsequence_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subsequence_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }